

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

XMLComment * __thiscall tinyxml2::XMLDocument::NewComment(XMLDocument *this,char *str)

{
  int iVar1;
  undefined4 extraout_var;
  XMLNode *pXVar2;
  
  iVar1 = (*(this->_commentPool).super_MemPool._vptr_MemPool[3])(&this->_commentPool);
  pXVar2 = (XMLNode *)CONCAT44(extraout_var,iVar1);
  pXVar2->_document = this;
  pXVar2->_parent = (XMLNode *)0x0;
  (pXVar2->_value)._flags = 0;
  (pXVar2->_value)._start = (char *)0x0;
  (pXVar2->_value)._end = (char *)0x0;
  pXVar2->_parseLineNum = 0;
  pXVar2->_userData = (void *)0x0;
  pXVar2->_memPool = (MemPool *)0x0;
  pXVar2->_firstChild = (XMLNode *)0x0;
  pXVar2->_lastChild = (XMLNode *)0x0;
  pXVar2->_prev = (XMLNode *)0x0;
  pXVar2->_next = (XMLNode *)0x0;
  ((XMLNode *)&pXVar2->_vptr_XMLNode)->_vptr_XMLNode = (_func_int **)&PTR_ToElement_001c3400;
  pXVar2->_memPool = &(this->_commentPool).super_MemPool;
  DynArray<tinyxml2::XMLNode_*,_10>::EnsureCapacity(&this->_unlinked,(this->_unlinked)._size + 1);
  iVar1 = (this->_unlinked)._size;
  (this->_unlinked)._mem[iVar1] = pXVar2;
  (this->_unlinked)._size = iVar1 + 1;
  StrPair::SetStr(&pXVar2->_value,str,0);
  return (XMLComment *)pXVar2;
}

Assistant:

XMLComment* XMLDocument::NewComment(const char* str)
{
    XMLComment* comment = CreateUnlinkedNode<XMLComment>(_commentPool);
    comment->SetValue(str);
    return comment;
}